

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_1::SharedContextResetCase::iterate(SharedContextResetCase *this)

{
  EGLConfig *config;
  EGLDisplay *display;
  glActiveTextureFunc *pp_Var1;
  ShaderType SVar2;
  TestLog *pTVar3;
  InfiniteLoop *this_00;
  RenderingContext contextA;
  EGLint attribListShared [9];
  RenderingContext contextB;
  Functions gl;
  
  pTVar3 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,
                  "A reset in one context will result in a reset in all other contexts in its share group\n\n"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  attribListShared[4] = 0x30bf;
  attribListShared[5] = 1;
  attribListShared[6] = 0x3138;
  attribListShared[7] = 0x31bf;
  attribListShared[0] = 0x3098;
  attribListShared[1] = 3;
  attribListShared[2] = 0x30fb;
  attribListShared[3] = 1;
  attribListShared[8] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,attribListShared);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"Create context A (share_context = EGL_NO_CONTEXT)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  config = &(this->super_RobustnessTestCase).m_eglConfig;
  display = &(this->super_RobustnessTestCase).m_eglDisplay;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)0x0;
  RenderingContext::RenderingContext
            (&contextA,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,attribListShared
             ,config,display,&gl.activeShaderProgram);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"Create context B (share_context = context A)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  gl.activeShaderProgram = (glActiveShaderProgramFunc)contextA.m_context;
  RenderingContext::RenderingContext
            (&contextB,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,attribListShared
             ,config,display,&gl.activeShaderProgram);
  RenderingContext::makeCurrent(&contextA,&(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions(&gl);
  RenderingContext::initGLFunctions(&contextA,&gl);
  checkRequiredGLRobustnessExtension(attribListShared,&gl);
  this_00 = (InfiniteLoop *)operator_new(0x48);
  SVar2 = (this->super_RobustnessTestCase).m_params.m_shaderType;
  (this_00->super_ContextReset).m_gl = &gl;
  (this_00->super_ContextReset).m_log = pTVar3;
  (this_00->super_ContextReset).m_shaderType = SVar2;
  (this_00->super_ContextReset)._vptr_ContextReset = (_func_int **)&PTR__InfiniteLoop_01e032f0;
  this_00->m_outputBuffer = 0;
  this_00->m_coordinatesBuffer = 0;
  this_00->m_coordLocation = 0;
  InfiniteLoop::setup(this_00);
  (*(this_00->super_ContextReset)._vptr_ContextReset[3])(this_00);
  (*(this_00->super_ContextReset)._vptr_ContextReset[4])(this_00);
  ContextReset::finish((ContextReset *)this_00);
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,QP_TEST_RESULT_PASS,"Pass");
  (*(this_00->super_ContextReset)._vptr_ContextReset[1])(this_00);
  RenderingContext::~RenderingContext(&contextB);
  RenderingContext::~RenderingContext(&contextA);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate	(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "A reset in one context will result in a reset in all other contexts in its share group\n\n"
			<< tcu::TestLog::EndMessage;

		// Create two share contexts with the same reset notification strategies
		const EGLint attribListShared[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribListShared);

		log << tcu::TestLog::Message << "Create context A (share_context = EGL_NO_CONTEXT)" << tcu::TestLog::EndMessage;
		RenderingContext contextA(m_eglTestCtx, attribListShared, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);

		log << tcu::TestLog::Message << "Create context B (share_context = context A)" << tcu::TestLog::EndMessage;
		RenderingContext contextB(m_eglTestCtx, attribListShared, m_eglConfig, m_eglDisplay, contextA.getContext());

		contextA.makeCurrent(m_eglSurface);

		glw::Functions gl;
		contextA.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribListShared, gl);

		DE_ASSERT(m_params.getContextResetType() == CONTEXTRESETTYPE_INFINITE_LOOP);
		de::UniquePtr<ContextReset> contextReset(new InfiniteLoop(gl, log, m_params.getShaderType()));

		contextReset->setup();
		contextReset->draw();

		try
		{
			contextReset->teardown();
			contextReset->finish();
		}
		catch (const glu::Error& error)
		{
			if (error.getError() == GL_CONTEXT_LOST)
			{
				contextB.makeCurrent(m_eglSurface);

				contextB.initGLFunctions(&gl);
				gl.getString(GL_VERSION); // arbitrary gl call

				if (gl.getError() != GL_CONTEXT_LOST)
				{
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! glGetError() returned wrong value. Expected GL_CONTEXT_LOST in context B");
					return STOP;
				}
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! glGetError() returned wrong value. Expected GL_CONTEXT_LOST in context A");
				return STOP;
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}